

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O2

void __thiscall Centaurus::Stage1Runner::thread_runner_impl(Stage1Runner *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->m_current_bank = -1;
  this->m_counter = 0;
  reset_banks(this);
  iVar1 = (*this->m_parser->_vptr_IParser[2])
                    (this->m_parser,this,(this->super_BaseRunner).m_input_window);
  this->m_result = (void *)CONCAT44(extraout_var,iVar1);
  release_bank(this);
  signal_exit(this);
  return;
}

Assistant:

void thread_runner_impl()
  {
    m_current_bank = -1;
    m_counter = 0;
    reset_banks();

    m_result = (*m_parser)(static_cast<BaseListener*>(this), m_input_window);

    release_bank();
    signal_exit();
  }